

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# levenberg_marquardt.cpp
# Opt level: O1

int __thiscall HimmelblauFunctor::operator()(HimmelblauFunctor *this,VectorXd *z,VectorXd *fvec)

{
  double dVar1;
  double dVar2;
  long lVar3;
  double *pdVar4;
  
  lVar3 = (z->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if ((0 < lVar3) && (lVar3 != 1)) {
    lVar3 = (fvec->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
    if (0 < lVar3) {
      pdVar4 = (z->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
      dVar1 = *pdVar4;
      dVar2 = pdVar4[1];
      pdVar4 = (fvec->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
      *pdVar4 = dVar1 * dVar1 + dVar2 + -11.0;
      if (lVar3 != 1) {
        pdVar4[1] = dVar2 * dVar2 + dVar1 + -7.0;
        return 0;
      }
    }
    __assert_fail("index >= 0 && index < size()",
                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                 );
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
               );
}

Assistant:

int operator()(const Eigen::VectorXd &z, Eigen::VectorXd &fvec) const
    {
        double x = z(0);   double y = z(1);
        /*
        * Evaluate Himmelblau's function.
        * Important: LevenbergMarquardt is designed to work with objective functions that are a sum
        * of squared terms. The algorithm takes this into account: do not do it yourself.
        * In other words: objFun = sum(fvec(i)^2)
        */
        fvec(0) = x * x + y - 11;
        fvec(1) = x + y * y - 7;
        return 0;
    }